

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

void __thiscall
chatra::Class::cumulativeInitializeForPackage
          (Class *this,IErrorReceiver *errorReceiver,StringTable *sTable,IClassFinder *classFinder,
          Node *node)

{
  bool bVar1;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *this_00;
  element_type *peVar2;
  element_type *peVar3;
  RuntimeException *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  allocator local_b9;
  string local_b8;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *local_88;
  shared_ptr<chatra::Node> *n;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *__range1;
  unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
  varSyncMap;
  Node *node_local;
  IClassFinder *classFinder_local;
  StringTable *sTable_local;
  IErrorReceiver *errorReceiver_local;
  Class *this_local;
  
  this->node = node;
  varSyncMap._M_h._M_single_bucket = (__node_base_ptr)node;
  getSyncMap((unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
              *)&__range1,node);
  this_00 = (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             *)(varSyncMap._M_h._M_single_bucket + 0x12);
  __end1 = std::
           vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
           begin(this_00);
  n = (shared_ptr<chatra::Node> *)
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                *)&n);
    if (!bVar1) {
      std::
      unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
      ::~unordered_map((unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
                        *)&__range1);
      return;
    }
    local_88 = &__gnu_cxx::
                __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                ::operator*(&__end1)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    if (peVar2->type == Var) {
      peVar3 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(local_88);
      addVariables(errorReceiver,&this->methods,
                   (unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
                    *)&__range1,this,peVar3);
    }
    else {
      peVar2 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      if (peVar2->type == Def) {
        peVar2 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_88);
        if (peVar2->sid == Init) {
          peVar3 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(local_88);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_b8,
                     "package-level init() cannot be defined in interactive mode",&local_b9);
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_d8);
          errorAtNode(errorReceiver,Error,peVar3,&local_b8,&local_d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_d8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          this_01 = (RuntimeException *)__cxa_allocate_exception(0x10);
          RuntimeException::RuntimeException(this_01,ParserErrorException);
          __cxa_throw(this_01,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
        }
        peVar3 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(local_88);
        addMethod(&this->methods,errorReceiver,sTable,classFinder,peVar3,(Class *)0x0);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Class::cumulativeInitializeForPackage(IErrorReceiver& errorReceiver, const StringTable* sTable, IClassFinder& classFinder,
		Node* node) {

	chatra_assert(node->blockNodesState == NodeState::Parsed);
	this->node = node;

	std::unordered_map<Node*, Node*> varSyncMap = getSyncMap(node);

	for (auto& n : node->symbols) {
		if (n->type == NodeType::Var)
			addVariables(errorReceiver, methods, varSyncMap, this, n.get());
		else if (n->type == NodeType::Def) {
			if (n->sid == StringId::Init) {
				errorAtNode(errorReceiver, ErrorLevel::Error, n.get(),
						"package-level init() cannot be defined in interactive mode", {});
				throw RuntimeException(StringId::ParserErrorException);
			}
			else
				addMethod(methods, errorReceiver, sTable, classFinder, n.get(), nullptr);
		}
	}
}